

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

CUIter * __thiscall
bloaty::dwarf::InfoReader::GetCUIter
          (CUIter *__return_storage_ptr__,InfoReader *this,Section section,uint64_t offset)

{
  size_t *psVar1;
  long lVar2;
  string_view local_28;
  
  lVar2 = 0xd0;
  if (section == kDebugInfo) {
    lVar2 = 0x30;
  }
  psVar1 = (size_t *)((long)&(this->dwarf_->debug_abbrev)._M_len + lVar2);
  local_28._M_len = *psVar1;
  local_28._M_str = (char *)psVar1[1];
  ReadBytes(offset,&local_28);
  __return_storage_ptr__->section_ = section;
  (__return_storage_ptr__->next_unit_)._M_len = local_28._M_len;
  (__return_storage_ptr__->next_unit_)._M_str = local_28._M_str;
  return __return_storage_ptr__;
}

Assistant:

CUIter InfoReader::GetCUIter(Section section, uint64_t offset) {
  string_view data;

  if (section == Section::kDebugInfo) {
    data = dwarf_.debug_info;
  } else {
    data = dwarf_.debug_types;
  }

  SkipBytes(offset, &data);
  return CUIter(section, data);
}